

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SpawnProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double y;
  double dVar1;
  AActor *origin;
  PClassActor *type;
  AActor *pAVar2;
  player_t *ppVar3;
  PClass *pPVar4;
  byte bVar5;
  BYTE BVar6;
  int iVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  VMValue *pVVar9;
  AActor *pAVar10;
  undefined4 extraout_var_00;
  AActor *pAVar11;
  undefined4 extraout_var_01;
  long lVar12;
  PClassActor *pPVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  DVector2 v;
  double local_90;
  double local_78;
  double dStack_70;
  DAngle local_68;
  DVector3 local_60;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar15 = "(paramnum) < numparam";
LAB_003ca507:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003ca507;
  }
  origin = *(AActor **)&param->field_0;
  if (origin != (AActor *)0x0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar7 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
    }
    pPVar8 = (origin->super_DThinker).super_DObject.Class;
    bVar17 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar4 && bVar17) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar17 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar4) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar17) {
      pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ca507;
    }
  }
  if (numparam == 1) {
    pcVar15 = "(paramnum) < numparam";
LAB_003ca5e0:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0)))) {
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003ca5e0;
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if ((type != (PClassActor *)0x0) &&
     (pPVar13 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
    do {
      pPVar13 = (PClassActor *)(pPVar13->super_PClass).ParentClass;
      if (pPVar13 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
    } while (pPVar13 != (PClassActor *)0x0);
    if (pPVar13 == (PClassActor *)0x0) {
      pcVar15 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ca5e0;
    }
  }
  if (numparam < 3) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[2].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ca526;
    }
  }
  else {
    pVVar9 = param;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ca526:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5b9,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar21 = pVVar9[2].field_0.f;
  if (numparam < 4) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[3].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ca545;
    }
  }
  else {
    pVVar9 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ca545:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5ba,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar22 = pVVar9[3].field_0.f;
  if (numparam < 5) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[4].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ca564;
    }
  }
  else {
    pVVar9 = param;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ca564:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bb,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar24 = pVVar9[4].field_0.f;
  if (numparam < 6) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[5].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ca583;
    }
  }
  else {
    pVVar9 = param;
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
LAB_003ca583:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bc,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  uVar16 = pVVar9[5].field_0.i;
  if (numparam < 7) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[6].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003ca5a2;
    }
  }
  else {
    pVVar9 = param;
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ca5a2:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bd,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar23 = pVVar9[6].field_0.f;
  if (numparam < 8) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ca5c1;
    }
  }
  else if (param[7].field_0.field_3.Type != '\0') {
    pcVar15 = "(param[paramnum]).Type == REGT_INT";
LAB_003ca5c1:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5be,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar10 = COPY_AAPTR(origin,param[7].field_0.i);
  uVar14 = uVar16 & 3;
  if ((pAVar10 == (AActor *)0x0) && (uVar14 != 2)) {
    if ((uVar16 & 8) == 0) {
      return 0;
    }
    if (origin->SeeState == (FState *)0x0) {
      return 0;
    }
    if ((origin->health < 1) && (((origin->flags3).Value & 0x2000) != 0)) {
      return 0;
    }
    AActor::SetState(origin,origin->SeeState,false);
    return 0;
  }
  if (type == (PClassActor *)0x0) {
    return 0;
  }
  dVar18 = FFastTrig::cos(&fasttrig,
                          ((origin->Angles).Yaw.Degrees + -90.0) * 11930464.711111112 +
                          6755399441055744.0);
  dVar19 = FFastTrig::sin(&fasttrig,dVar18);
  local_90 = 0.0;
  dVar20 = AActor::GetBobOffset(origin,0.0);
  if (origin->player != (player_t *)0x0) {
    local_90 = origin->player->crouchoffset;
  }
  dVar18 = dVar18 * dVar22;
  dVar19 = dVar19 * dVar22;
  if (uVar14 == 1) {
    dVar22 = AActor::GetBobOffset(origin,0.0);
    P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,dVar18,dVar19);
    local_60.Z = dVar21 + dVar22 + (origin->__Pos).Z;
    pAVar10 = P_SpawnMissileXYZ(&local_60,origin,pAVar10,type,false,(AActor *)0x0);
  }
  else {
    dVar22 = (origin->__Pos).X;
    y = (origin->__Pos).Y;
    dVar1 = (origin->__Pos).Z;
    if (uVar14 == 2) {
      P_GetOffsetPosition(dVar22,y,dVar18,dVar19);
      dVar19 = (origin->__Pos).Z + 0.0;
      (origin->__Pos).Z = dVar19;
      (origin->__Pos).X = local_78;
      (origin->__Pos).Y = dStack_70;
      dVar18 = AActor::GetBobOffset(origin,0.0);
      local_68.Degrees = (origin->Angles).Yaw.Degrees;
      pAVar10 = P_SpawnMissileAngleZSpeed
                          (origin,dVar18 + dVar19 + dVar21,type,&local_68,0.0,
                           *(double *)((type->super_PClass).Defaults + 0xe0),origin,false);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).Y = y;
      (origin->__Pos).X = dVar22;
      uVar16 = uVar16 | 0x10;
    }
    else {
      P_GetOffsetPosition(dVar22,y,dVar18,dVar19);
      local_48.Z = dVar21 + dVar20 + -32.0 + local_90 + (origin->__Pos).Z;
      (origin->__Pos).Z = local_48.Z;
      (origin->__Pos).Y = dStack_70;
      (origin->__Pos).X = local_78;
      local_48.Z = local_48.Z + 32.0;
      pAVar10 = P_SpawnMissileXYZ(&local_48,origin,pAVar10,type,false,(AActor *)0x0);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).Y = y;
      (origin->__Pos).X = dVar22;
    }
  }
  if (pAVar10 == (AActor *)0x0) {
    return 0;
  }
  if ((uVar16 & 0x30) == 0) {
    dVar21 = (pAVar10->Vel).X;
    dVar22 = (pAVar10->Vel).Y;
    dVar21 = c_sqrt(dVar22 * dVar22 + dVar21 * dVar21);
  }
  else {
    if ((uVar16 & 0x20) != 0) {
      dVar21 = (pAVar10->Vel).X;
      dVar22 = (pAVar10->Vel).Y;
      dVar21 = c_sqrt(dVar22 * dVar22 + dVar21 * dVar21);
      dVar21 = c_atan2((pAVar10->Vel).Z,dVar21);
      dVar23 = dVar23 + dVar21 * 57.29577951308232;
    }
    dVar21 = FFastTrig::cos(&fasttrig,dVar23 * 11930464.711111112 + 6755399441055744.0);
    dVar21 = ABS(dVar21 * pAVar10->Speed);
    dVar22 = FFastTrig::sin(&fasttrig,dVar21);
    dVar22 = dVar22 * pAVar10->Speed;
    (pAVar10->Vel).Z = dVar22;
    if ((uVar16 >> 8 & 1) == 0) {
      (pAVar10->Vel).Z = -dVar22;
    }
  }
  if ((uVar16 & 0x40) != 0) {
    (pAVar10->Angles).Pitch.Degrees = dVar23;
  }
  if (-1 < (char)uVar16) {
    dVar24 = dVar24 + (pAVar10->Angles).Yaw.Degrees;
  }
  (pAVar10->Angles).Yaw.Degrees = dVar24;
  AActor::VelFromAngle(pAVar10,dVar21);
  bVar5 = *(byte *)((long)&(origin->flags).Value + 2);
  if ((uVar16 & 4) != 0 && (bVar5 & 1) == 0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar7 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
    }
    bVar5 = ((origin->super_DThinker).super_DObject.Class)->Defaults[0x1be] & 1;
  }
  pAVar2 = origin;
  if ((bVar5 & 1) == 0) {
    lVar12 = 0x208;
    if (((pAVar10->flags2).Value & 0x40000000) != 0) goto LAB_003ca454;
  }
  else {
    while( true ) {
      pAVar11 = pAVar2;
      uVar14 = (pAVar11->flags).Value & 0x10000;
      bVar5 = (byte)(uVar14 >> 0x10);
      if (((uVar16 & 4) != 0) && (uVar14 == 0)) {
        if ((pAVar11->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(pAVar11->super_DThinker).super_DObject._vptr_DObject)(pAVar11);
          (pAVar11->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar7);
        }
        bVar5 = ((pAVar11->super_DThinker).super_DObject.Class)->Defaults[0x1be] & 1;
      }
      if ((bVar5 == 0) || (pAVar2 = (pAVar11->target).field_0.p, pAVar2 == (AActor *)0x0))
      goto LAB_003ca435;
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) break;
      pAVar2 = (pAVar11->target).field_0.p;
      if ((pAVar2 != (AActor *)0x0) &&
         (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar11->target).field_0.p = (AActor *)0x0;
        pAVar2 = (AActor *)0x0;
      }
    }
    (pAVar11->target).field_0.p = (AActor *)0x0;
LAB_003ca435:
    (pAVar10->target).field_0.p = pAVar11;
    lVar12 = 0x278;
    if ((((pAVar10->flags2).Value & (origin->flags2).Value) >> 0x1e & 1) != 0) {
LAB_003ca454:
      (pAVar10->tracer).field_0 =
           *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
            ((long)&(origin->super_DThinker).super_DObject._vptr_DObject + lVar12);
    }
  }
  if (((pAVar10->flags4).Value & 0x40000) == 0) goto LAB_003ca4b2;
  pAVar2 = (pAVar10->target).field_0.p;
  if (pAVar2 == (AActor *)0x0) {
LAB_003ca4a9:
    BVar6 = '\0';
  }
  else {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar10->target).field_0.p = (AActor *)0x0;
      goto LAB_003ca4a9;
    }
    ppVar3 = ((pAVar10->target).field_0.p)->player;
    if (ppVar3 == (player_t *)0x0) goto LAB_003ca4a9;
    BVar6 = (char)((int)ppVar3 + 0xfe81a1b0U >> 5) * '=' + '\x01';
  }
  pAVar10->FriendPlayer = BVar6;
LAB_003ca4b2:
  P_CheckMissileSpawn(pAVar10,origin->radius);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnProjectile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT_DEF	(Spawnheight);
	PARAM_FLOAT_DEF	(Spawnofs_xy);
	PARAM_ANGLE_DEF	(Angle);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(Pitch);
	PARAM_INT_DEF	(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	int aimmode = flags & CMF_AIMMODE;

	AActor * targ;
	AActor * missile;

	if (ref != NULL || aimmode == 2)
	{
		if (ti) 
		{
			DAngle angle = self->Angles.Yaw - 90;
			double x = Spawnofs_xy * angle.Cos();
			double y = Spawnofs_xy * angle.Sin();
			double z = Spawnheight + self->GetBobOffset() - 32 + (self->player? self->player->crouchoffset : 0.);

			DVector3 pos = self->Pos();
			switch (aimmode)
			{
			case 0:
			default:
				// same adjustment as above (in all 3 directions this time) - for better aiming!
				self->SetXYZ(self->Vec3Offset(x, y, z));
				missile = P_SpawnMissileXYZ(self->PosPlusZ(32.), self, ref, ti, false);
				self->SetXYZ(pos);
				break;

			case 1:
				missile = P_SpawnMissileXYZ(self->Vec3Offset(x, y, self->GetBobOffset() + Spawnheight), self, ref, ti, false);
				break;

			case 2:
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				missile = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, ti, self->Angles.Yaw, 0, GetDefaultByType(ti)->Speed, self, false);
				self->SetXYZ(pos);

				flags |= CMF_ABSOLUTEPITCH;

				break;
			}

			if (missile != NULL)
			{
				// Use the actual velocity instead of the missile's Speed property
				// so that this can handle missiles with a high vertical velocity 
				// component properly.

				double missilespeed;

				if ( (CMF_ABSOLUTEPITCH|CMF_OFFSETPITCH) & flags)
				{
					if (CMF_OFFSETPITCH & flags)
					{
						Pitch += missile->Vel.Pitch();
					}
					missilespeed = fabs(Pitch.Cos() * missile->Speed);
					missile->Vel.Z = Pitch.Sin() * missile->Speed;
					if (!(flags & CMF_BADPITCH)) missile->Vel.Z *= -1;
				}
				else
				{
					missilespeed = missile->VelXYToSpeed();
				}

				if (CMF_SAVEPITCH & flags)
				{
					missile->Angles.Pitch = Pitch;
					// In aimmode 0 and 1 without absolutepitch or offsetpitch, the pitch parameter
					// contains the unapplied parameter. In that case, it is set as pitch without
					// otherwise affecting the spawned actor.
				}

				missile->Angles.Yaw = (CMF_ABSOLUTEANGLE & flags) ? Angle : missile->Angles.Yaw + Angle;
				missile->VelFromAngle(missilespeed);
	
				// handle projectile shooting projectiles - track the
				// links back to a real owner
                if (self->isMissile(!!(flags & CMF_TRACKOWNER)))
                {
                	AActor *owner = self ;//->target;
                	while (owner->isMissile(!!(flags & CMF_TRACKOWNER)) && owner->target)
						owner = owner->target;
                	targ = owner;
                	missile->target = owner;
					// automatic handling of seeker missiles
					if (self->flags2 & missile->flags2 & MF2_SEEKERMISSILE)
					{
						missile->tracer = self->tracer;
					}
                }
				else if (missile->flags2 & MF2_SEEKERMISSILE)
				{
					// automatic handling of seeker missiles
					missile->tracer = self->target;
				}
				// we must redo the spectral check here because the owner is set after spawning so the FriendPlayer value may be wrong
				if (missile->flags4 & MF4_SPECTRAL)
				{
					if (missile->target != NULL)
					{
						missile->SetFriendPlayer(missile->target->player);
					}
					else
					{
						missile->FriendPlayer = 0;
					}
				}
				P_CheckMissileSpawn(missile, self->radius);
			}
		}
	}
	else if (flags & CMF_CHECKTARGETDEAD)
	{
		// Target is dead and the attack shall be aborted.
		if (self->SeeState != NULL && (self->health > 0 || !(self->flags3 & MF3_ISMONSTER)))
			self->SetState(self->SeeState);
	}
	return 0;
}